

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

bool __thiscall CommandLineArguments::setShuffle(CommandLineArguments *this,int ac,char **av,int *i)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  SimpleString shuffleParameter;
  SimpleString SStack_38;
  
  this->shuffling_ = true;
  uVar2 = (*GetPlatformSpecificTimeInMillis)();
  this->shuffleSeed_ = (uVar2 & 0xffffffff) + (ulong)((uVar2 & 0xffffffff) == 0);
  SimpleString::SimpleString(&SStack_38,av[*i]);
  sVar3 = SimpleString::size(&SStack_38);
  if (sVar3 < 3) {
    if (*i + 1 < ac) {
      uVar1 = SimpleString::AtoU(av[(long)*i + 1]);
      if (uVar1 != 0) {
        this->shufflingPreSeeded_ = true;
        this->shuffleSeed_ = (ulong)uVar1;
        *i = *i + 1;
      }
    }
  }
  else {
    this->shufflingPreSeeded_ = true;
    uVar1 = SimpleString::AtoU(av[*i] + 2);
    this->shuffleSeed_ = (ulong)uVar1;
  }
  sVar3 = this->shuffleSeed_;
  SimpleString::~SimpleString(&SStack_38);
  return sVar3 != 0;
}

Assistant:

bool CommandLineArguments::setShuffle(int ac, const char * const *av, int& i)
{
    shuffling_ = true;
    shuffleSeed_ = (unsigned int)GetPlatformSpecificTimeInMillis();
    if (shuffleSeed_ == 0) shuffleSeed_++;

    SimpleString shuffleParameter = av[i];
    if (shuffleParameter.size() > 2) {
        shufflingPreSeeded_ = true;
        shuffleSeed_ = SimpleString::AtoU(av[i] + 2);
    } else if (i + 1 < ac) {
        unsigned int parsedParameter = SimpleString::AtoU(av[i + 1]);
        if (parsedParameter != 0)
        {
            shufflingPreSeeded_ = true;
            shuffleSeed_ = parsedParameter;
            i++;
        }
    }
    return (shuffleSeed_ != 0);
}